

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBTooSmallStrideTest *this,GLuint test_case_index)

{
  pointer ptVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  ulong uVar4;
  TestError *this_00;
  stringstream stream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(&local_1a8,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  std::operator<<(poVar2,", case: ");
  uVar4 = (ulong)ptVar1[test_case_index].m_case;
  if (uVar4 < 4) {
    std::operator<<(&local_1a8,&DAT_01658acc + *(int *)(&DAT_01658acc + uVar4 * 4));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x5157);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBTooSmallStrideTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", case: ";

	switch (test_case.m_case)
	{
	case OFFSET:
		stream << "buffer stride: 40, vec4 offset: 32";
		break;
	case STRIDE:
		stream << "buffer stride: 32, vec4 off 16 stride: 32";
		break;
	case BLOCK:
		stream << "buffer stride: 32, block 3xvec4 offset 0";
		break;
	case ARRAY:
		stream << "buffer stride: 32, vec4[4] offset 16";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}